

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart.hpp
# Opt level: O2

Lazy<cinatra::part_head_t> __thiscall
cinatra::multipart_reader_t<cinatra::coro_http_client>::read_part_head
          (multipart_reader_t<cinatra::coro_http_client> *this,string_view boundary)

{
  coro_http_client *pcVar1;
  
  pcVar1 = (coro_http_client *)operator_new(0x128,(nothrow_t *)&std::nothrow);
  if (pcVar1 == (coro_http_client *)0x0) {
    this->conn_ = (coro_http_client *)0x0;
  }
  else {
    (pcVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)read_part_head;
    (pcVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)read_part_head;
    (pcVar1->parser_).headers_._M_elems[6].name._M_len = (size_t)boundary._M_str;
    (pcVar1->parser_).headers_._M_elems[5].value._M_str = (char *)boundary._M_len;
    *(undefined8 *)&pcVar1->parser_ = 0;
    (pcVar1->parser_).msg_._M_len = 0;
    (pcVar1->parser_).msg_._M_str = (char *)0x0;
    *(undefined1 *)&(pcVar1->parser_).headers_._M_elems[1].value._M_len = 0;
    this->conn_ = pcVar1;
    *(undefined1 *)((long)&(pcVar1->parser_).headers_._M_elems[6].value._M_str + 4) = 0;
  }
  return (LazyBase<cinatra::part_head_t,_false>)(LazyBase<cinatra::part_head_t,_false>)this;
}

Assistant:

async_simple::coro::Lazy<part_head_t> read_part_head(
      std::string_view boundary) {
    if (boundary.empty()) {
      co_return part_head_t{std::make_error_code(std::errc::protocol_error)};
    }

    if (head_buf_.size() > 0) {
      const char *data_ptr = asio::buffer_cast<const char *>(head_buf_.data());
      chunked_buf_.sputn(data_ptr, head_buf_.size());
      head_buf_.consume(head_buf_.size());
    }

    part_head_t result{};
    std::error_code ec{};
    size_t size;

    auto get_part_name = [](std::string_view data, std::string_view name,
                            size_t start) {
      start += name.length();
      size_t end = data.find("\"", start);
      return data.substr(start, end - start);
    };

    constexpr std::string_view name = "name=\"";
    constexpr std::string_view filename = "filename=\"";

    while (true) {
      if (std::tie(ec, size) =
              co_await conn_->async_read_until(chunked_buf_, CRCF);
          ec) {
        result.ec = ec;
        conn_->close();
        co_return result;
      }

      const char *data_ptr =
          asio::buffer_cast<const char *>(chunked_buf_.data());
      chunked_buf_.consume(size);
      if (*data_ptr == '-') {
        continue;
      }
      std::string_view data{data_ptr, size};
      if (size == 2) {  // got the head end: \r\n\r\n
        break;
      }

      if (size_t pos = data.find("name"); pos != std::string_view::npos) {
        result.name = get_part_name(data, name, pos);

        if (size_t pos = data.find("filename"); pos != std::string_view::npos) {
          result.filename = get_part_name(data, filename, pos);
        }
        continue;
      }
    }

    co_return result;
  }